

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderVkImpl::GetBytecode(ShaderVkImpl *this,void **ppBytecode,Uint64 *Size)

{
  bool bVar1;
  Char *Message;
  size_type sVar2;
  uint *local_68;
  undefined1 local_40 [8];
  string msg;
  Uint64 *Size_local;
  void **ppBytecode_local;
  ShaderVkImpl *this_local;
  
  msg.field_2._8_8_ = Size;
  bVar1 = ShaderBase<Diligent::EngineVkImplTraits>::IsCompiling
                    (&this->super_ShaderBase<Diligent::EngineVkImplTraits>);
  if (bVar1) {
    FormatString<char[108]>
              ((string *)local_40,
               (char (*) [108])
               "Shader byte code is not available until the shader is compiled. Use GetStatus() to check the shader status."
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetBytecode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderVkImpl.hpp"
               ,0x6c);
    std::__cxx11::string::~string((string *)local_40);
  }
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_SPIRV);
  if (bVar1) {
    local_68 = (uint *)0x0;
  }
  else {
    local_68 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(&this->m_SPIRV);
  }
  *ppBytecode = local_68;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_SPIRV);
  *(size_type *)msg.field_2._8_8_ = sVar2 << 2;
  return;
}

Assistant:

GetBytecode(const void** ppBytecode,
                                                Uint64&      Size) const override final
    {
        DEV_CHECK_ERR(!IsCompiling(), "Shader byte code is not available until the shader is compiled. Use GetStatus() to check the shader status.");
        *ppBytecode = !m_SPIRV.empty() ? m_SPIRV.data() : nullptr;
        Size        = m_SPIRV.size() * sizeof(m_SPIRV[0]);
    }